

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall APhyBullet::BulletWorld::BulletWorld(BulletWorld *this,btDynamicsWorld *handle)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  world *in_stack_ffffffffffffffc0;
  
  aphy::world::world(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__BulletWorld_002e1428;
  in_RDI[2] = in_RSI;
  aphy::ref<aphy::collision_dispatcher>::ref((ref<aphy::collision_dispatcher> *)(in_RDI + 3));
  aphy::ref<aphy::broadphase>::ref((ref<aphy::broadphase> *)(in_RDI + 4));
  aphy::ref<aphy::constraint_solver>::ref((ref<aphy::constraint_solver> *)(in_RDI + 5));
  aphy::ref<aphy::collision_configuration>::ref((ref<aphy::collision_configuration> *)(in_RDI + 6));
  std::
  unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
  ::unordered_set((unordered_set<aphy::ref<aphy::collision_object>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::allocator<aphy::ref<aphy::collision_object>_>_>
                   *)0x135c9d);
  std::
  unordered_set<aphy::ref<aphy::character_controller>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::allocator<aphy::ref<aphy::character_controller>_>_>
  ::unordered_set((unordered_set<aphy::ref<aphy::character_controller>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::allocator<aphy::ref<aphy::character_controller>_>_>
                   *)0x135cab);
  std::shared_ptr<APhyBullet::BulletWorldDebugDrawer>::shared_ptr
            ((shared_ptr<APhyBullet::BulletWorldDebugDrawer> *)0x135cbc);
  return;
}

Assistant:

BulletWorld::BulletWorld(btDynamicsWorld *handle)
    : handle(handle)
{
}